

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.cc
# Opt level: O1

ssize_t io_buf::read_file_or_socket(int f,void *buf,size_t nbytes)

{
  ssize_t sVar1;
  
  sVar1 = ::read(f,buf,nbytes & 0xffffffff);
  return sVar1;
}

Assistant:

ssize_t io_buf::read_file_or_socket(int f, void* buf, size_t nbytes)
{
#ifdef _WIN32
  if (is_socket(f))
    return recv(f, reinterpret_cast<char*>(buf), static_cast<int>(nbytes), 0);
  else
    return _read(f, buf, (unsigned int)nbytes);
#else
  return read(f, buf, (unsigned int)nbytes);
#endif
}